

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

void __thiscall miniros::TransportTCP::enableWrite(TransportTCP *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex_);
  if (iVar2 == 0) {
    bVar1 = this->closed_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
    if ((bVar1 == false) && (this->expecting_write_ == false)) {
      PollSet::addEvents(this->poll_set_,this->sock_,4);
      this->expecting_write_ = true;
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TransportTCP::enableWrite()
{
  MINIROS_ASSERT(!(flags_ & SYNCHRONOUS));

  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      return;
    }
  }

  if (!expecting_write_)
  {
    poll_set_->addEvents(sock_, POLLOUT);
    expecting_write_ = true;
  }
}